

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int capture_ptr(frozen *f,char *ptr,json_type type)

{
  json_token *pjVar1;
  int local_34;
  void *p;
  int new_size;
  json_type type_local;
  char *ptr_local;
  frozen *f_local;
  
  if ((f->do_realloc != 0) && (f->max_tokens <= f->num_tokens)) {
    if (f->max_tokens == 0) {
      local_34 = 100;
    }
    else {
      local_34 = f->max_tokens << 1;
    }
    pjVar1 = (json_token *)realloc(f->tokens,(long)local_34 * 0x18);
    if (pjVar1 == (json_token *)0x0) {
      return -3;
    }
    f->max_tokens = local_34;
    f->tokens = pjVar1;
  }
  if ((f->tokens == (json_token *)0x0) || (f->max_tokens == 0)) {
    f_local._4_4_ = 0;
  }
  else if (f->num_tokens < f->max_tokens) {
    f->tokens[f->num_tokens].ptr = ptr;
    f->tokens[f->num_tokens].type = type;
    f->num_tokens = f->num_tokens + 1;
    f_local._4_4_ = 0;
  }
  else {
    f_local._4_4_ = -3;
  }
  return f_local._4_4_;
}

Assistant:

static int capture_ptr(struct frozen *f, const char *ptr, enum json_type type) {
    if (f->do_realloc && f->num_tokens >= f->max_tokens) {
        int new_size = f->max_tokens == 0 ? 100 : f->max_tokens * 2;
        void *p = FROZEN_REALLOC(f->tokens, new_size * sizeof(f->tokens[0]));
        if (p == NULL) return JSON_TOKEN_ARRAY_TOO_SMALL;
        f->max_tokens = new_size;
        f->tokens = (struct json_token *) p;
    }
    if (f->tokens == NULL || f->max_tokens == 0) return 0;
    if (f->num_tokens >= f->max_tokens) return JSON_TOKEN_ARRAY_TOO_SMALL;
    f->tokens[f->num_tokens].ptr = ptr;
    f->tokens[f->num_tokens].type = type;
    f->num_tokens++;
    return 0;
}